

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O3

void __thiscall
Js::DynamicProfileInfo::RecordFieldAccess
          (DynamicProfileInfo *this,FunctionBody *functionBody,uint fieldAccessId,Var object,
          FldInfoFlags flags)

{
  undefined1 *puVar1;
  FldInfoFlags FVar2;
  byte bVar3;
  code *pcVar4;
  bool bVar5;
  ValueType VVar6;
  uint32 uVar7;
  undefined4 *puVar8;
  FldInfo *pFVar9;
  byte bVar10;
  
  uVar7 = FunctionBody::GetCountField(functionBody,InlineCacheCount);
  if (uVar7 <= fieldAccessId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x4ed,"(fieldAccessId < functionBody->GetProfiledFldCount())",
                                "fieldAccessId < functionBody->GetProfiledFldCount()");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  pFVar9 = (this->fldInfo).ptr;
  FVar2 = pFVar9[fieldAccessId].flags;
  if (object != (Var)0x0) {
    VVar6 = ValueType::Merge(&pFVar9[fieldAccessId].valueType,object);
    ((anon_union_2_4_ea848c7b_for_ValueType_13 *)((this->fldInfo).ptr + fieldAccessId))->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar6.field_0;
    pFVar9 = (this->fldInfo).ptr;
  }
  pFVar9[fieldAccessId].flags = FVar2 | flags;
  if ((flags & FldInfo_Polymorphic) == FldInfo_NoInfo) {
    if (flags == FldInfo_NoInfo) {
      return;
    }
    bVar3 = pFVar9[fieldAccessId].polymorphicInlineCacheUtilization;
    if (bVar3 == 0xff) {
      return;
    }
    if (bVar3 < 2) {
      pFVar9[fieldAccessId].polymorphicInlineCacheUtilization = '\0';
      return;
    }
    bVar10 = bVar3 - 1;
  }
  else {
    puVar1 = &(this->bits).field_0x3;
    *puVar1 = *puVar1 | 4;
    if ((FVar2 & FldInfo_Polymorphic) == FldInfo_NoInfo) {
      SetHasNewPolyFieldAccess(this,functionBody);
      pFVar9 = (this->fldInfo).ptr;
    }
    if (0xf4 < pFVar9[fieldAccessId].polymorphicInlineCacheUtilization) {
      pFVar9[fieldAccessId].polymorphicInlineCacheUtilization = 0xff;
      return;
    }
    bVar10 = pFVar9[fieldAccessId].polymorphicInlineCacheUtilization + 10;
  }
  pFVar9[fieldAccessId].polymorphicInlineCacheUtilization = bVar10;
  return;
}

Assistant:

void DynamicProfileInfo::RecordFieldAccess(FunctionBody* functionBody, uint fieldAccessId, Var object, FldInfoFlags flags)
    {
        Assert(fieldAccessId < functionBody->GetProfiledFldCount());
        FldInfoFlags oldFlags = fldInfo[fieldAccessId].flags;
        if (object) // if not provided, the saved value type is not changed
        {
            fldInfo[fieldAccessId].valueType = fldInfo[fieldAccessId].valueType.Merge(object);
        }
        const auto mergedFlags = MergeFldInfoFlags(oldFlags, flags);
        fldInfo[fieldAccessId].flags = mergedFlags;
        if (flags & FldInfo_Polymorphic)
        {
            bits.hasPolymorphicFldAccess = true;
            if (!(oldFlags & FldInfo_Polymorphic))
            {
                this->SetHasNewPolyFieldAccess(functionBody);
            }
            if (fldInfo[fieldAccessId].polymorphicInlineCacheUtilization < (PolymorphicInlineCacheUtilizationMaxValue - PolymorphicInlineCacheUtilizationIncrement))
            {
                fldInfo[fieldAccessId].polymorphicInlineCacheUtilization += PolymorphicInlineCacheUtilizationIncrement;
            }
            else
            {
                fldInfo[fieldAccessId].polymorphicInlineCacheUtilization = PolymorphicInlineCacheUtilizationMaxValue;
            }
        }
        else if (flags != FldInfo_NoInfo &&
            fldInfo[fieldAccessId].polymorphicInlineCacheUtilization != PolymorphicInlineCacheUtilizationMaxValue)
        {
            if (fldInfo[fieldAccessId].polymorphicInlineCacheUtilization > (PolymorphicInlineCacheUtilizationMinValue + PolymorphicInlineCacheUtilizationDecrement))
            {
                fldInfo[fieldAccessId].polymorphicInlineCacheUtilization -= PolymorphicInlineCacheUtilizationDecrement;
            }
            else
            {
                fldInfo[fieldAccessId].polymorphicInlineCacheUtilization = PolymorphicInlineCacheUtilizationMinValue;
            }
        }
    }